

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O0

void __thiscall TypeChar::saveXml(TypeChar *this,ostream *s)

{
  ostream *s_00;
  allocator local_39;
  string local_38 [32];
  ostream *local_18;
  ostream *s_local;
  TypeChar *this_local;
  
  local_18 = s;
  s_local = (ostream *)this;
  std::operator<<(s,"<type");
  Datatype::saveXmlBasic((Datatype *)this,local_18);
  s_00 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"char",&local_39);
  a_v_b(s_00,(string *)local_38,true);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::operator<<(local_18,"/>");
  return;
}

Assistant:

void TypeChar::saveXml(ostream &s) const

{
  s << "<type";
  saveXmlBasic(s);
  a_v_b(s,"char",true);
  s << "/>";
}